

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.cpp
# Opt level: O3

void __thiscall
cppgenerate::Method::printImplementation(Method *this,Class *parent,ostream *stream,bool inHeader)

{
  char cVar1;
  ostream *poVar2;
  string parentName;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  
  local_80 = 0;
  local_78[0] = 0;
  local_88 = local_78;
  if ((1 < (this->m_name)._M_string_length) && (1 < (this->m_returnType)._M_string_length)) {
    if (parent != (Class *)0x0 && !inHeader) {
      Class::getName_abi_cxx11_(&local_48,parent);
      std::__cxx11::string::operator=((string *)&local_88,(string *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    if (inHeader) {
      if (this->m_isVirtual == true) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,"virtual ",8);
      }
    }
    else if (this->m_isPureVirtual == false) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_88,local_88 + local_80);
      printMethodSignature(this,stream,&local_68,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    cVar1 = (char)stream;
    if (this->m_isPureVirtual == false) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"{",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      poVar2 = operator<<(stream,&this->m_code);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(stream,"}",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
    }
    if ((inHeader) && (this->m_isPureVirtual == true)) {
      std::__ostream_insert<char,std::char_traits<char>>(stream," = 0;",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
    }
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return;
}

Assistant:

Method& Method::setPureVirtual( bool isPureVirtual ){
    if( isPureVirtual ){
        m_isVirtual = true;
    }
    m_isPureVirtual = isPureVirtual;

    return *this;
}